

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mimemap.c
# Opt level: O2

void h2o_mimemap_on_context_init(h2o_mimemap_t *mimemap,h2o_context_t *ctx)

{
  kh_extmap_t *pkVar1;
  byte bVar2;
  khint_t __i;
  uint uVar3;
  
  bVar2 = 0;
  for (uVar3 = 0; pkVar1 = mimemap->extmap, uVar3 != pkVar1->n_buckets; uVar3 = uVar3 + 1) {
    if (((pkVar1->flags[uVar3 >> 4] >> (bVar2 & 0x1e) & 3) == 0) &&
       (pkVar1->vals[uVar3]->type == H2O_MIMEMAP_TYPE_DYNAMIC)) {
      h2o_context_init_pathconf_context(ctx,(h2o_pathconf_t *)&(pkVar1->vals[uVar3]->data).field_0);
    }
    bVar2 = bVar2 + 2;
  }
  return;
}

Assistant:

void h2o_mimemap_on_context_init(h2o_mimemap_t *mimemap, h2o_context_t *ctx)
{
    const char *ext;
    h2o_mimemap_type_t *type;

    kh_foreach(mimemap->extmap, ext, type, {
        switch (type->type) {
        case H2O_MIMEMAP_TYPE_DYNAMIC:
            h2o_context_init_pathconf_context(ctx, &type->data.dynamic.pathconf);
            break;
        case H2O_MIMEMAP_TYPE_MIMETYPE:
            break;
        }
    });
}